

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

string * __thiscall
lzstring::LZString::CompressToEncodedURIComponent
          (string *__return_storage_ptr__,LZString *this,wstring *input)

{
  wstring tmp;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:82:40)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:82:40)>
               ::_M_manager;
    Compress(&tmp,this,input,6,(GetCharFromIntFunc *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    to_string(__return_storage_ptr__,&tmp);
    std::__cxx11::wstring::~wstring((wstring *)&tmp);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LZString::CompressToEncodedURIComponent(const std::wstring &input)
{
	if (input.empty())
		return std::string();

	std::wstring tmp = Compress(input, 6, [](int code) { return (wchar_t)kKeyStrUriSafe[code]; });
	std::string res = to_string(tmp);
	return res;
}